

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O3

char * ini_property_name(ini_t *ini,int section,int property)

{
  ini_internal_property_t *piVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  
  if ((-1 < section && ini != (ini_t *)0x0) && (section < ini->section_count)) {
    if (0 < (long)ini->property_count) {
      piVar1 = ini->properties;
      lVar3 = 0;
      iVar4 = 0;
      do {
        if (*(int *)(piVar1->name + lVar3 + -4) == section) {
          if (iVar4 == property) {
            pcVar2 = *(char **)(piVar1->value + lVar3 + -8);
            if (*(char **)(piVar1->value + lVar3 + -8) == (char *)0x0) {
              pcVar2 = piVar1->name + lVar3;
            }
            return pcVar2;
          }
          iVar4 = iVar4 + 1;
        }
        lVar3 = lVar3 + 0x78;
      } while ((long)ini->property_count * 0x78 - lVar3 != 0);
    }
    return (char *)0x0;
  }
  return (char *)0x0;
}

Assistant:

char const* ini_property_name( ini_t const* ini, int section, int property )
    {
    int p;

    if( ini && section >= 0 && section < ini->section_count )
        {
        p = ini_internal_property_index( ini, section, property );
        if( p != INI_NOT_FOUND )
            return ini->properties[ p ].name_large ? ini->properties[ p ].name_large : ini->properties[ p ].name;
        }

    return NULL;
    }